

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int status;
  N_Vector Xv [3];
  sunrealtype cv [3];
  N_Vector vtemp3;
  N_Vector vtemp2;
  N_Vector vtemp1;
  N_Vector u;
  N_Vector *r;
  N_Vector p;
  N_Vector v;
  N_Vector d;
  N_Vector q;
  N_Vector r_star;
  N_Vector sb;
  N_Vector sx;
  int *nli;
  sunrealtype *res_norm;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  void *P_data;
  void *A_data;
  int l_max;
  int m;
  int n;
  int *zeroguess;
  int b_ok;
  int converged;
  int scale_b;
  int scale_x;
  int preOnRight;
  int preOnLeft;
  sunrealtype temp_val;
  sunrealtype r_curr_norm;
  sunrealtype r_init_norm;
  sunrealtype rho [2];
  sunrealtype omega;
  sunrealtype v_bar;
  sunrealtype sigma;
  sunrealtype c;
  sunrealtype beta;
  sunrealtype eta;
  sunrealtype tau;
  sunrealtype alpha;
  SUNContext_conflict sunctx_local_scope_;
  double local_1e8;
  double local_1e0;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  bool local_19e;
  bool local_19d;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  double local_178;
  double local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  long local_110;
  long local_108;
  int *local_100;
  double *local_f8;
  code *local_f0;
  code *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int *local_c0;
  int local_b8;
  int local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  double local_30;
  undefined8 local_28;
  undefined8 local_20;
  long *local_10;
  int local_4;
  
  local_30 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_38 = in_RDI[2];
  local_cc = *(int *)*in_RDI;
  local_118 = *(undefined8 *)(*in_RDI + 0x58);
  local_120 = *(undefined8 *)(*in_RDI + 0x60);
  local_128 = *(undefined8 *)(*in_RDI + 0x68);
  local_130 = *(undefined8 *)(*in_RDI + 0x70);
  local_138 = *(undefined8 *)(*in_RDI + 0x78);
  local_140 = *(undefined8 **)(*in_RDI + 0x80);
  local_148 = *(undefined8 *)(*in_RDI + 0x88);
  local_150 = *(undefined8 *)(*in_RDI + 0x90);
  local_158 = *(undefined8 *)(*in_RDI + 0x98);
  local_160 = *(undefined8 *)(*in_RDI + 0xa0);
  local_110 = *(long *)(*in_RDI + 0x48);
  local_108 = *(long *)(*in_RDI + 0x50);
  local_d8 = *(undefined8 *)(*in_RDI + 0x28);
  local_e0 = *(undefined8 *)(*in_RDI + 0x40);
  local_e8 = *(code **)(*in_RDI + 0x20);
  local_f0 = *(code **)(*in_RDI + 0x38);
  local_c0 = (int *)(*in_RDI + 8);
  local_100 = (int *)(*in_RDI + 0xc);
  local_f8 = (double *)(*in_RDI + 0x10);
  local_98 = -1.0;
  local_a0 = -1.0;
  *local_100 = 0;
  local_b4 = 0;
  local_b8 = 0;
  local_19d = true;
  if (*(int *)(*in_RDI + 4) != 1) {
    local_19d = *(int *)(*in_RDI + 4) == 3;
  }
  local_a4 = (uint)local_19d;
  local_19e = true;
  if (*(int *)(*in_RDI + 4) != 2) {
    local_19e = *(int *)(*in_RDI + 4) == 3;
  }
  local_a8 = (uint)local_19e;
  local_ac = (uint)(local_108 != 0);
  local_b0 = (uint)(local_110 != 0);
  if ((local_a8 == 0) || (*local_c0 != 0)) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (*local_c0 == 0) {
      iVar2 = (*local_e8)(local_d8,in_RDX,local_118);
      if (iVar2 != 0) {
        *local_c0 = 0;
        uVar3 = 0x323;
        if (iVar2 < 0) {
          uVar3 = 0xfffffcdb;
        }
        *(undefined4 *)(*local_10 + 0x18) = uVar3;
        return *(int *)(*local_10 + 0x18);
      }
      N_VLinearSum(0,0xbff0000000000000,local_28,local_118,local_118);
    }
    else {
      N_VScale(0,in_RCX,local_118);
    }
    if (local_a4 == 0) {
      N_VScale(0,local_118,local_150);
    }
    else {
      iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_118,local_150,1);
      if (iVar2 != 0) {
        *local_c0 = 0;
        uVar3 = 0x325;
        if (iVar2 < 0) {
          uVar3 = 0xfffffcd8;
        }
        *(undefined4 *)(*local_10 + 0x18) = uVar3;
        return *(int *)(*local_10 + 0x18);
      }
    }
    if (local_b0 == 0) {
      N_VScale(0,local_150,local_118);
    }
    else {
      N_VProd(local_110,local_150,local_118);
    }
    local_88 = (double)N_VDotProd(local_118,local_118);
    if (0.0 < local_88) {
      local_1a8 = sqrt(local_88);
    }
    else {
      local_1a8 = 0.0;
    }
    local_90 = local_1a8;
    *local_f8 = local_1a8;
    if (local_30 < local_1a8) {
      if (local_ac == 0) {
        N_VScale(0,local_118,local_150);
      }
      else {
        N_VDiv(local_118,local_108,local_150);
      }
      if (local_a8 != 0) {
        N_VScale(0,local_150,local_130);
        iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_130,local_150,2);
        if (iVar2 != 0) {
          *local_c0 = 0;
          uVar3 = 0x325;
          if (iVar2 < 0) {
            uVar3 = 0xfffffcd8;
          }
          *(undefined4 *)(*local_10 + 0x18) = uVar3;
          return *(int *)(*local_10 + 0x18);
        }
      }
      iVar2 = (*local_e8)(local_d8,local_150,local_130);
      if (iVar2 == 0) {
        if (local_a4 == 0) {
          N_VScale(0,local_130,local_150);
        }
        else {
          iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_130,local_150,1);
          if (iVar2 != 0) {
            *local_c0 = 0;
            uVar3 = 0x325;
            if (iVar2 < 0) {
              uVar3 = 0xfffffcd8;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar3;
            return *(int *)(*local_10 + 0x18);
          }
        }
        if (local_b0 == 0) {
          N_VScale(0,local_150,local_130);
        }
        else {
          N_VProd(local_110,local_150,local_130);
        }
        N_VScale(0,local_118,*local_140);
        N_VScale(0,local_118,local_148);
        N_VScale(0,local_118,local_138);
        N_VConst(0,local_128);
        if ((local_ac != 0) && (*local_c0 == 0)) {
          N_VProd(local_108,local_20,local_20);
        }
        local_48 = local_90;
        local_50 = 0.0;
        local_70 = 0.0;
        for (local_c4 = 0; local_c4 < local_cc; local_c4 = local_c4 + 1) {
          *local_100 = *local_100 + 1;
          local_68 = (double)N_VDotProd(local_118,local_130);
          local_40 = local_88 / local_68;
          N_VLinearSum(0,-local_40,local_148,local_130,local_120);
          N_VLinearSum(0,local_148,local_120,local_140[1]);
          if (local_ac != 0) {
            N_VDiv(local_140[1],local_108,local_140[1]);
          }
          if (local_a8 != 0) {
            N_VScale(0,local_140[1],local_150);
            iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_150,local_140[1],2);
            if (iVar2 != 0) {
              *local_c0 = 0;
              uVar3 = 0x325;
              if (iVar2 < 0) {
                uVar3 = 0xfffffcd8;
              }
              *(undefined4 *)(*local_10 + 0x18) = uVar3;
              return *(int *)(*local_10 + 0x18);
            }
          }
          iVar2 = (*local_e8)(local_d8,local_140[1],local_150);
          if (iVar2 != 0) {
            *local_c0 = 0;
            uVar3 = 0x323;
            if (iVar2 < 0) {
              uVar3 = 0xfffffcdb;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar3;
            return *(int *)(*local_10 + 0x18);
          }
          if (local_a4 == 0) {
            N_VScale(0,local_150,local_140[1]);
          }
          else {
            iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_150,local_140[1],1);
            if (iVar2 != 0) {
              *local_c0 = 0;
              uVar3 = 0x325;
              if (iVar2 < 0) {
                uVar3 = 0xfffffcd8;
              }
              *(undefined4 *)(*local_10 + 0x18) = uVar3;
              return *(int *)(*local_10 + 0x18);
            }
          }
          if (local_b0 == 0) {
            N_VScale(0,local_140[1],local_150);
          }
          else {
            N_VProd(local_110,local_140[1],local_150);
          }
          N_VLinearSum(0,-local_40,*local_140,local_150,local_140[1]);
          for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
            if (local_c8 == 0) {
              local_a0 = (double)N_VDotProd(local_140[1],local_140[1]);
              if (0.0 < local_a0) {
                local_1b0 = sqrt(local_a0);
              }
              else {
                local_1b0 = 0.0;
              }
              local_a0 = local_1b0;
              local_78 = (double)N_VDotProd(*local_140,*local_140);
              if (0.0 < local_78) {
                local_1b8 = sqrt(local_78);
              }
              else {
                local_1b8 = 0.0;
              }
              if (0.0 < local_1b8 * local_a0) {
                if (0.0 < local_78) {
                  local_1c8 = sqrt(local_78);
                }
                else {
                  local_1c8 = 0.0;
                }
                local_1c0 = sqrt(local_1c8 * local_a0);
              }
              else {
                local_1c0 = 0.0;
              }
              local_78 = local_1c0;
              N_VLinearSum(0,(local_70 * local_70 * local_50) / local_40,local_148,local_128,
                           local_128);
            }
            else {
              local_78 = local_a0;
              N_VLinearSum(0,(local_70 * local_70 * local_50) / local_40,local_120,local_128,
                           local_128);
            }
            local_70 = local_78 / local_48;
            if (0.0 < local_70 * local_70 + 1.0) {
              local_1d0 = sqrt(local_70 * local_70 + 1.0);
            }
            else {
              local_1d0 = 0.0;
            }
            local_60 = 1.0 / local_1d0;
            local_48 = local_48 * local_70 * local_60;
            local_50 = local_60 * local_60 * local_40;
            if (((local_c4 == 0) && (local_c8 == 0)) && (*local_c0 != 0)) {
              N_VScale(SUB84(local_50,0),local_128,local_20);
            }
            else {
              N_VLinearSum(0,local_50,local_20,local_128,local_20);
            }
            dVar1 = local_48;
            if (0.0 < (double)(local_c8 + 1)) {
              local_1e0 = sqrt((double)(local_c8 + 1));
            }
            else {
              local_1e0 = 0.0;
            }
            local_98 = dVar1 * local_1e0;
            *local_f8 = local_98;
            if (local_98 <= local_30) {
              local_b4 = 1;
              break;
            }
            if ((local_30 < local_98) ||
               (((local_90 <= local_98 && (local_c8 == 1)) && (local_c4 == local_cc)))) {
              if (local_ac == 0) {
                N_VScale(0,local_20,local_150);
              }
              else {
                N_VDiv(local_20,local_108,local_150);
              }
              if (local_a8 != 0) {
                iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_150,local_158,2);
                if (iVar2 != 0) {
                  *local_c0 = 0;
                  uVar3 = 0x325;
                  if (iVar2 < 0) {
                    uVar3 = 0xfffffcd8;
                  }
                  *(undefined4 *)(*local_10 + 0x18) = uVar3;
                  return *(int *)(*local_10 + 0x18);
                }
                N_VScale(0,local_158,local_150);
              }
              iVar2 = (*local_e8)(local_d8,local_150,local_158);
              if (iVar2 != 0) {
                *local_c0 = 0;
                uVar3 = 0x323;
                if (iVar2 < 0) {
                  uVar3 = 0xfffffcdb;
                }
                *(undefined4 *)(*local_10 + 0x18) = uVar3;
                return *(int *)(*local_10 + 0x18);
              }
              if (local_a4 == 0) {
                N_VScale(0,local_158,local_150);
              }
              else {
                iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_158,local_150,1);
                if (iVar2 != 0) {
                  *local_c0 = 0;
                  uVar3 = 0x325;
                  if (iVar2 < 0) {
                    uVar3 = 0xfffffcd8;
                  }
                  *(undefined4 *)(*local_10 + 0x18) = uVar3;
                  return *(int *)(*local_10 + 0x18);
                }
              }
              if (local_b0 == 0) {
                N_VScale(0,local_150,local_158);
              }
              else {
                N_VProd(local_110,local_150,local_158);
              }
              if (local_b8 == 0) {
                local_b8 = 1;
                if (local_a4 == 0) {
                  N_VScale(0,local_28,local_160);
                }
                else {
                  iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_28,local_160,1);
                  if (iVar2 != 0) {
                    *local_c0 = 0;
                    uVar3 = 0x325;
                    if (iVar2 < 0) {
                      uVar3 = 0xfffffcd8;
                    }
                    *(undefined4 *)(*local_10 + 0x18) = uVar3;
                    return *(int *)(*local_10 + 0x18);
                  }
                }
                if (local_b0 != 0) {
                  N_VProd(local_110,local_160,local_160);
                }
              }
              N_VLinearSum(0,0xbff0000000000000,local_160,local_158,local_150);
              local_98 = (double)N_VDotProd(local_150,local_150);
              if (0.0 < local_98) {
                local_1e8 = sqrt(local_98);
              }
              else {
                local_1e8 = 0.0;
              }
              local_98 = local_1e8;
              *local_f8 = local_1e8;
              if (local_1e8 <= local_30) {
                local_b4 = 1;
                break;
              }
            }
          }
          if (local_b4 == 1) break;
          local_80 = (double)N_VDotProd(local_118,local_140[1]);
          local_58 = local_80 / local_88;
          N_VLinearSum(0,local_58,local_140[1],local_120,local_148);
          local_178 = local_58 * local_58;
          local_198 = local_138;
          local_170 = local_58;
          local_190 = local_120;
          local_168 = 0x3ff0000000000000;
          local_188 = local_148;
          N_VLinearCombination(3,&local_178,&local_198,local_138);
          if (local_ac == 0) {
            N_VScale(0,local_138,local_150);
          }
          else {
            N_VDiv(local_138,local_108,local_150);
          }
          if (local_a8 != 0) {
            N_VScale(0,local_150,local_130);
            iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_130,local_150,2);
            if (iVar2 != 0) {
              *local_c0 = 0;
              uVar3 = 0x325;
              if (iVar2 < 0) {
                uVar3 = 0xfffffcd8;
              }
              *(undefined4 *)(*local_10 + 0x18) = uVar3;
              return *(int *)(*local_10 + 0x18);
            }
          }
          iVar2 = (*local_e8)(local_d8,local_150,local_130);
          if (iVar2 != 0) {
            *local_c0 = 0;
            uVar3 = 0x323;
            if (iVar2 < 0) {
              uVar3 = 0xfffffcdb;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar3;
            return *(int *)(*local_10 + 0x18);
          }
          if (local_a4 == 0) {
            N_VScale(0,local_130,local_150);
          }
          else {
            iVar2 = (*local_f0)(SUB84(local_30,0),local_e0,local_130,local_150,1);
            if (iVar2 != 0) {
              *local_c0 = 0;
              uVar3 = 0x325;
              if (iVar2 < 0) {
                uVar3 = 0xfffffcd8;
              }
              *(undefined4 *)(*local_10 + 0x18) = uVar3;
              return *(int *)(*local_10 + 0x18);
            }
          }
          if (local_b0 == 0) {
            N_VScale(0,local_150,local_130);
          }
          else {
            N_VProd(local_110,local_150,local_130);
          }
          N_VScale(0,local_140[1],*local_140);
          local_88 = local_80;
        }
        if ((local_b4 == 1) || (local_98 < local_90)) {
          if (local_ac != 0) {
            N_VDiv(local_20,local_108,local_20);
          }
          if (local_a8 != 0) {
            iVar2 = (*local_f0)(local_30._0_4_,local_e0,local_20,local_150,2);
            if (iVar2 != 0) {
              *local_c0 = 0;
              uVar3 = 0x325;
              if (iVar2 < 0) {
                uVar3 = 0xfffffcd8;
              }
              *(undefined4 *)(*local_10 + 0x18) = uVar3;
              return *(int *)(*local_10 + 0x18);
            }
            N_VScale(0,local_150,local_20);
          }
          *local_c0 = 0;
          if (local_b4 == 1) {
            *(undefined4 *)(*local_10 + 0x18) = 0;
          }
          else {
            *(undefined4 *)(*local_10 + 0x18) = 0x321;
          }
          local_4 = *(int *)(*local_10 + 0x18);
        }
        else {
          *local_c0 = 0;
          *(undefined4 *)(*local_10 + 0x18) = 0x322;
          local_4 = *(int *)(*local_10 + 0x18);
        }
      }
      else {
        *local_c0 = 0;
        uVar3 = 0x323;
        if (iVar2 < 0) {
          uVar3 = 0xfffffcdb;
        }
        *(undefined4 *)(*local_10 + 0x18) = uVar3;
        local_4 = *(int *)(*local_10 + 0x18);
      }
    }
    else {
      *local_c0 = 0;
      *(undefined4 *)(*local_10 + 0x18) = 0;
      local_4 = *(int *)(*local_10 + 0x18);
    }
  }
  else {
    *local_c0 = 0;
    *(undefined4 *)(*in_RDI + 0x18) = 0xffffd8f2;
    local_4 = -0x270e;
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                           N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, tau, eta, beta, c, sigma, v_bar, omega;
  sunrealtype rho[2];
  sunrealtype r_init_norm, r_curr_norm;
  sunrealtype temp_val;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged, b_ok;
  sunbooleantype* zeroguess;
  int n, m, l_max;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  N_Vector sx, sb, r_star, q, d, v, p, *r, u, vtemp1, vtemp2, vtemp3;
  sunrealtype cv[3];
  N_Vector Xv[3];
  int status = SUN_SUCCESS;

  /* Make local shortcuts to solver variables. */
  l_max     = SPTFQMR_CONTENT(S)->maxl;
  r_star    = SPTFQMR_CONTENT(S)->r_star;
  q         = SPTFQMR_CONTENT(S)->q;
  d         = SPTFQMR_CONTENT(S)->d;
  v         = SPTFQMR_CONTENT(S)->v;
  p         = SPTFQMR_CONTENT(S)->p;
  r         = SPTFQMR_CONTENT(S)->r;
  u         = SPTFQMR_CONTENT(S)->u;
  vtemp1    = SPTFQMR_CONTENT(S)->vtemp1;
  vtemp2    = SPTFQMR_CONTENT(S)->vtemp2;
  vtemp3    = SPTFQMR_CONTENT(S)->vtemp3;
  sb        = SPTFQMR_CONTENT(S)->s1;
  sx        = SPTFQMR_CONTENT(S)->s2;
  A_data    = SPTFQMR_CONTENT(S)->ATData;
  P_data    = SPTFQMR_CONTENT(S)->PData;
  atimes    = SPTFQMR_CONTENT(S)->ATimes;
  psolve    = SPTFQMR_CONTENT(S)->Psolve;
  zeroguess = &(SPTFQMR_CONTENT(S)->zeroguess);
  nli       = &(SPTFQMR_CONTENT(S)->numiters);
  res_norm  = &(SPTFQMR_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  temp_val = r_curr_norm = -ONE;
  *nli                   = 0;
  converged              = SUNFALSE;
  b_ok                   = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale_x    = (sx != NULL);
  scale_b    = (sb != NULL);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = sptfqmr");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed unsupported configuration");

    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_star = r_0 = b - A*x_0 */
  /* NOTE: if x == 0 then just set residual to b and continue */
  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star (or really just r_0) */
  if (preOnLeft)
  {
    status = psolve(P_data, r_star, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, r_star);
    SUNCheckLastErr();
  }

  /* Initialize rho[0] */
  /* NOTE: initialized here to reduce number of computations - avoid need
           to compute r_star^T*r_star twice, and avoid needlessly squaring
           values */
  rho[0] = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Compute norm of initial residual (r_0) to see if we really need
     to do anything */
  *res_norm = r_init_norm = SUNRsqrt(rho[0]);

  if (r_init_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "cur-iter = 0, res-norm = %.16g, status = success", *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger, "linear-iterate",
             "cur-iter = 0, res-norm = %.16g", *res_norm);

  /* Set v = A*r_0 (preconditioned and scaled) */
  if (scale_x)
  {
    N_VDiv(r_star, sx, vtemp1);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (preOnRight)
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }

  status = atimes(A_data, vtemp1, v);
  if (status != 0)
  {
    *zeroguess = SUNFALSE;
    LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed matvec, retval = %d", status);

    return (LASTFLAG(S));
  }

  if (preOnLeft)
  {
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, v, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, v);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
  }

  /* Initialize remaining variables */
  N_VScale(ONE, r_star, r[0]);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, u);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();
  N_VConst(ZERO, d);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  tau   = r_init_norm;
  v_bar = eta = ZERO;

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = continue");

  /* START outer loop */
  for (n = 0; n < l_max; ++n)
  {
    SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

    /* Increment linear iteration counter */
    (*nli)++;

    /* sigma = r_star^T*v */
    sigma = N_VDotProd(r_star, v);
    SUNCheckLastErr();

    /* alpha = rho[0]/sigma */
    alpha = rho[0] / sigma;

    /* q = u-alpha*v */
    N_VLinearSum(ONE, u, -alpha, v, q);
    SUNCheckLastErr();

    /* r[1] = r[0]-alpha*A*(u+q) */
    N_VLinearSum(ONE, u, ONE, q, r[1]);
    SUNCheckLastErr();
    if (scale_x)
    {
      N_VDiv(r[1], sx, r[1]);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, r[1], vtemp1);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, vtemp1, r[1]);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, r[1], vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
    }
    N_VLinearSum(ONE, r[0], -alpha, vtemp1, r[1]);
    SUNCheckLastErr();

    /* START inner loop */
    for (m = 0; m < 2; ++m)
    {
      /* d = [*]+(v_bar^2*eta/alpha)*d */
      /* NOTES:
       *   (1) [*] = u if m == 0, and q if m == 1
       *   (2) using temp_val reduces the number of required computations
       *       if the inner loop is executed twice
       */
      if (m == 0)
      {
        temp_val = N_VDotProd(r[1], r[1]);
        SUNCheckLastErr();
        temp_val = SUNRsqrt(temp_val);
        omega    = N_VDotProd(r[0], r[0]);
        SUNCheckLastErr();
        omega = SUNRsqrt(SUNRsqrt(omega) * temp_val);
        N_VLinearSum(ONE, u, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }
      else
      {
        omega = temp_val;
        N_VLinearSum(ONE, q, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }

      /* v_bar = omega/tau */
      v_bar = omega / tau;

      /* c = (1+v_bar^2)^(-1/2) */
      c = ONE / SUNRsqrt(ONE + SUNSQR(v_bar));

      /* tau = tau*v_bar*c */
      tau = tau * v_bar * c;

      /* eta = c^2*alpha */
      eta = SUNSQR(c) * alpha;

      /* x = x+eta*d */
      if (n == 0 && m == 0 && *zeroguess)
      {
        N_VScale(eta, d, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, eta, d, x);
        SUNCheckLastErr();
      }

      /* Check for convergence... */
      /* NOTE: just use approximation to norm of residual, if possible */
      *res_norm = r_curr_norm = tau * SUNRsqrt(m + 1);

      /* Exit inner loop if iteration has converged based upon approximation
         to norm of current residual */
      if (r_curr_norm <= delta)
      {
        SUNLogInfo(S->sunctx->logger, "linear-iterate",
                   "cur-iter = %i, res-norm = %.16g", n + 1, *nli, *res_norm);

        converged = SUNTRUE;
        break;
      }

      /* Decide if actual norm of residual vector should be computed */
      /* NOTES:
       *   (1) if r_curr_norm > delta, then check if actual residual norm
       *       is OK (recall we first compute an approximation)
       *   (2) if r_curr_norm >= r_init_norm and m == 1 and n == l_max, then
       *       compute actual residual norm to see if the iteration can be
       *       saved
       *   (3) the scaled and preconditioned right-hand side of the given
       *       linear system (denoted by b) is only computed once, and the
       *       result is stored in vtemp3 so it can be reused - reduces the
       *       number of psovles if using left preconditioning
       */
      if ((r_curr_norm > delta) ||
          (r_curr_norm >= r_init_norm && m == 1 && n == l_max))
      {
        /* Compute norm of residual ||b-A*x||_2 (preconditioned and scaled) */
        if (scale_x)
        {
          N_VDiv(x, sx, vtemp1);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, x, vtemp1);
          SUNCheckLastErr();
        }

        if (preOnRight)
        {
          status = psolve(P_data, vtemp1, vtemp2, delta, SUN_PREC_RIGHT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_REC;

            SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                       "status = failed preconditioner solve, retval = %d",
                       status);

            return (LASTFLAG(S));
          }
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        status = atimes(A_data, vtemp1, vtemp2);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                     : SUNLS_ATIMES_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed matvec, retval = %d", status);

          return (LASTFLAG(S));
        }

        if (preOnLeft)
        {
          status = psolve(P_data, vtemp2, vtemp1, delta, SUN_PREC_LEFT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_REC;

            SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                       "status = failed preconditioner solve, retval = %d",
                       status);

            return (LASTFLAG(S));
          }
        }
        else
        {
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        if (scale_b)
        {
          N_VProd(sb, vtemp1, vtemp2);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, vtemp1, vtemp2);
          SUNCheckLastErr();
        }

        /* Only precondition and scale b once (result saved for reuse) */
        if (!b_ok)
        {
          b_ok = SUNTRUE;
          if (preOnLeft)
          {
            status = psolve(P_data, b, vtemp3, delta, SUN_PREC_LEFT);
            if (status != 0)
            {
              *zeroguess  = SUNFALSE;
              LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                         : SUNLS_PSOLVE_FAIL_REC;

              SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                         "status = failed preconditioner solve, retval = %d",
                         status);

              return (LASTFLAG(S));
            }
          }
          else
          {
            N_VScale(ONE, b, vtemp3);
            SUNCheckLastErr();
          }

          if (scale_b)
          {
            N_VProd(sb, vtemp3, vtemp3);
            SUNCheckLastErr();
          }
        }
        N_VLinearSum(ONE, vtemp3, -ONE, vtemp2, vtemp1);
        SUNCheckLastErr();
        r_curr_norm = N_VDotProd(vtemp1, vtemp1);
        SUNCheckLastErr();
        *res_norm = r_curr_norm = SUNRsqrt(r_curr_norm);

        /* Exit inner loop if inequality condition is satisfied
           (meaning exit if we have converged) */
        if (r_curr_norm <= delta)
        {
          SUNLogInfo(S->sunctx->logger, "linear-iterate",
                     "cur-iter = %i, res-norm = %.16g", n + 1, *nli, *res_norm);

          converged = SUNTRUE;
          break;
        }
      }

      SUNLogInfo(S->sunctx->logger, "linear-iterate",
                 "cur-iter = %i, res-norm = %.16g", n + 1, *nli, *res_norm);

    } /* END inner loop */

    /* If converged, then exit outer loop as well */
    if (converged == SUNTRUE) { break; }

    /* rho[1] = r_star^T*r_[1] */
    rho[1] = N_VDotProd(r_star, r[1]);
    SUNCheckLastErr();

    /* beta = rho[1]/rho[0] */
    beta = rho[1] / rho[0];

    /* u = r[1]+beta*q */
    N_VLinearSum(ONE, r[1], beta, q, u);
    SUNCheckLastErr();

    /* p = u+beta*(q+beta*p) = beta*beta*p + beta*q + u */
    cv[0] = SUNSQR(beta);
    Xv[0] = p;

    cv[1] = beta;
    Xv[1] = q;

    cv[2] = ONE;
    Xv[2] = u;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* v = A*p */
    if (scale_x)
    {
      N_VDiv(p, sx, vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp1);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, vtemp1, v);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, v, vtemp1);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, vtemp1, v);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
    }

    /* Shift variable values */
    /* NOTE: reduces storage requirements */
    N_VScale(ONE, r[1], r[0]);
    SUNCheckLastErr();
    rho[0] = rho[1];

    SUNLogInfoIf(n < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                 "status = continue");

  } /* END outer loop */

  /* Determine return value */
  /* If iteration converged or residual was reduced, then return current iterate
   * (x) */
  if ((converged == SUNTRUE) || (r_curr_norm < r_init_norm))
  {
    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp1, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE)
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      LASTFLAG(S) = SUN_SUCCESS;
    }
    else
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed residual reduced");

      LASTFLAG(S) = SUNLS_RES_REDUCED;
    }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed max iterations");

    return (LASTFLAG(S));
  }
}